

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O1

void __thiscall wasm::GenerateDynCalls::visitTable(GenerateDynCalls *this,Table *table)

{
  Module *this_00;
  ElementSegment *pEVar1;
  bool bVar2;
  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
  _Var3;
  pointer ppEVar4;
  Function *pFVar5;
  ulong uVar6;
  ulong uVar7;
  Table *table_local;
  
  this_00 = (this->
            super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
            ).super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
            .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
            currModule;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,__gnu_cxx::__ops::_Iter_pred<wasm::GenerateDynCalls::visitTable(wasm::Table*)::_lambda(std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>&)_1_>>
                    ((this_00->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this_00->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var3._M_current !=
      (this_00->elementSegments).
      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pEVar1 = ((_Var3._M_current)->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    bVar2 = wasm::Type::isFunction(&pEVar1->type);
    if ((bVar2) &&
       (ppEVar4 = *(pointer *)
                   &(pEVar1->data).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl,
       *(pointer *)
        ((long)&(pEVar1->data).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> + 8) !=
       ppEVar4)) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        if (ppEVar4[uVar6]->_id == RefFuncId) {
          pFVar5 = Module::getFunction(this_00,(IString)*(IString *)&ppEVar4[uVar6][1]._id);
          generateDynCallThunk(this,(HeapType)(pFVar5->type).id);
        }
        ppEVar4 = *(pointer *)
                   &(pEVar1->data).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl;
        bVar2 = uVar7 < (ulong)((long)*(pointer *)
                                       ((long)&(pEVar1->data).
                                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       + 8) - (long)ppEVar4 >> 3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void visitTable(Table* table) {
    // Generate dynCalls for functions in the table
    Module* wasm = getModule();
    auto& segments = wasm->elementSegments;

    // Find a single elem segment for the table. We only care about one, since
    // wasm-ld emits only one table with a single segment.
    auto it = std::find_if(segments.begin(),
                           segments.end(),
                           [&](std::unique_ptr<ElementSegment>& segment) {
                             return segment->table == table->name;
                           });
    if (it != segments.end()) {
      std::vector<Name> tableSegmentData;
      ElementUtils::iterElementSegmentFunctionNames(
        it->get(), [&](Name name, Index) {
          generateDynCallThunk(wasm->getFunction(name)->type);
        });
    }
  }